

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ImageBlitToImage::submit(ImageBlitToImage *this,SubmitContext *context)

{
  VkImageLayout VVar1;
  Context *this_00;
  DeviceInterface *pDVar2;
  VkCommandBuffer pVVar3;
  VkImage VVar4;
  Handle<(vk::HandleType)9> *pHVar5;
  undefined4 local_78;
  undefined4 local_74;
  VkImageBlit region;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  ImageBlitToImage *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(this_00);
  pVVar3 = SubmitContext::getCommandBuffer(context);
  local_78 = 1;
  local_74 = 0;
  region.srcSubresource.aspectMask = 0;
  region.srcSubresource.mipLevel = 1;
  region.srcSubresource.baseArrayLayer = 0;
  region.srcSubresource.layerCount = 0;
  region.srcOffsets[0].x = 0;
  region.srcOffsets[0].y = this->m_imageWidth;
  region.srcOffsets[0].z = this->m_imageHeight;
  region.srcOffsets[1].x = 1;
  region.srcOffsets[1].y = 1;
  region.srcOffsets[1].z = 0;
  region.dstSubresource.aspectMask = 0;
  region.dstSubresource.mipLevel = 1;
  region.dstSubresource.baseArrayLayer = 0;
  region.dstSubresource.layerCount = 0;
  region.dstOffsets[0].x = 0;
  region.dstOffsets[0].y = this->m_dstImageWidth;
  region.dstOffsets[0].z = this->m_dstImageHeight;
  region.dstOffsets[1].x = 1;
  region.dstOffsets[1]._4_8_ = pVVar3;
  VVar4 = SubmitContext::getImage(context);
  VVar1 = this->m_imageLayout;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (*pDVar2->_vptr_DeviceInterface[0x61])
            (pDVar2,pVVar3,VVar4.m_internal,(ulong)VVar1,pHVar5->m_internal,7,1,&local_78,0);
  return;
}

Assistant:

void ImageBlitToImage::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkImageBlit		region			=
	{
		// Src
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{
			{ 0, 0, 0 },
			{
				m_imageWidth,
				m_imageHeight,
				1
			},
		},

		// Dst
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{
			{ 0, 0, 0 },
			{
				m_dstImageWidth,
				m_dstImageHeight,
				1u
			}
		}
	};
	vkd.cmdBlitImage(commandBuffer, context.getImage(), m_imageLayout, *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region, vk::VK_FILTER_NEAREST);
}